

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::sse2::
     BVHNIntersector1<4,_1,_true,_embree::sse2::ArrayIntersector1<embree::sse2::QuadMiIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  uint *puVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  long lVar10;
  float *pfVar11;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  float **ppfVar16;
  float *pfVar17;
  float *pfVar18;
  float *pfVar19;
  float *pfVar20;
  Geometry *pGVar21;
  RTCIntersectArguments *pRVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined8 uVar31;
  undefined1 (*pauVar32) [16];
  undefined8 uVar33;
  int iVar34;
  undefined4 uVar35;
  undefined1 (*pauVar36) [16];
  long lVar37;
  undefined4 uVar39;
  RayHit *pRVar38;
  ulong uVar40;
  RTCRayQueryContext *pRVar41;
  Geometry *extraout_RDX;
  Geometry *extraout_RDX_00;
  ulong uVar42;
  ulong uVar43;
  uint *puVar44;
  ulong uVar45;
  RayQueryContext *pRVar46;
  ulong uVar47;
  ulong uVar48;
  RayHit *pRVar49;
  uint uVar50;
  uint uVar51;
  uint uVar52;
  uint uVar53;
  uint uVar54;
  uint uVar55;
  uint uVar56;
  uint uVar57;
  uint uVar58;
  uint uVar59;
  uint uVar60;
  uint uVar61;
  float fVar62;
  float fVar63;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  float fVar83;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar93;
  float fVar104;
  float fVar105;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  float fVar106;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  float fVar116;
  float fVar119;
  float fVar120;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  float fVar121;
  float fVar122;
  float fVar127;
  float fVar128;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  float fVar129;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  undefined1 auVar147 [16];
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  float fStack_1440;
  float fStack_143c;
  float fStack_1434;
  float local_1428;
  undefined1 local_13fc [20];
  float local_13e8;
  float fStack_13e4;
  undefined4 uStack_13e0;
  float fStack_13dc;
  undefined1 local_13d8 [24];
  ulong local_13c0;
  undefined8 local_13b8;
  uint auStack_13b0 [1];
  uint auStack_13ac [1];
  RTCFilterFunctionNArguments local_13a8;
  undefined8 local_1378;
  undefined8 uStack_1370;
  float local_1368;
  float local_1364;
  float local_1360;
  float local_135c;
  undefined4 local_1358;
  undefined4 local_1354;
  uint local_1350;
  uint local_134c;
  uint local_1348;
  float local_1338;
  float fStack_1334;
  float fStack_1330;
  float fStack_132c;
  float local_1328;
  float fStack_1324;
  float fStack_1320;
  float fStack_131c;
  ulong local_1318;
  ulong local_1310;
  undefined1 local_1308 [8];
  float fStack_1300;
  float fStack_12fc;
  float local_12f8;
  float fStack_12f4;
  float fStack_12f0;
  float fStack_12ec;
  undefined1 local_12e8 [8];
  float fStack_12e0;
  float fStack_12dc;
  float local_12d8;
  float fStack_12d4;
  float fStack_12d0;
  float fStack_12cc;
  undefined1 local_12c8 [8];
  float fStack_12c0;
  float fStack_12bc;
  float local_12b8;
  float fStack_12b4;
  float fStack_12b0;
  float fStack_12ac;
  undefined1 local_12a8 [16];
  undefined1 local_1298 [8];
  float fStack_1290;
  float fStack_128c;
  float local_1288;
  float fStack_1284;
  float fStack_1280;
  float fStack_127c;
  float local_1278;
  float fStack_1274;
  float fStack_1270;
  float fStack_126c;
  uint local_1268;
  uint uStack_1264;
  uint uStack_1260;
  uint uStack_125c;
  float local_1258;
  uint uStack_1254;
  uint uStack_1250;
  uint uStack_124c;
  undefined1 local_1248 [16];
  float local_1238 [4];
  undefined1 local_1228 [8];
  float fStack_1220;
  float fStack_121c;
  float local_1218 [4];
  float local_1208 [4];
  uint local_11f8;
  uint uStack_11f4;
  uint uStack_11f0;
  uint uStack_11ec;
  float local_11e8;
  float fStack_11e4;
  float fStack_11e0;
  float fStack_11dc;
  float local_11d8;
  float fStack_11d4;
  float fStack_11d0;
  float fStack_11cc;
  undefined8 local_11c8;
  float fStack_11c0;
  float fStack_11bc;
  float local_11b8;
  float fStack_11b4;
  float fStack_11b0;
  float fStack_11ac;
  float fStack_11a8;
  float fStack_11a4;
  long local_11a0;
  long local_1198;
  Scene *local_1190;
  float local_1188;
  float fStack_1184;
  float fStack_1180;
  float fStack_117c;
  float local_1178;
  float fStack_1174;
  float fStack_1170;
  float fStack_116c;
  float local_1168;
  float fStack_1164;
  float fStack_1160;
  float fStack_115c;
  undefined8 local_1158;
  float fStack_1150;
  float fStack_114c;
  float local_1148;
  float fStack_1144;
  float fStack_1140;
  float fStack_113c;
  float local_1138;
  float fStack_1134;
  float fStack_1130;
  float fStack_112c;
  float local_1128;
  float fStack_1124;
  float fStack_1120;
  float fStack_111c;
  float local_1118;
  float fStack_1114;
  float fStack_1110;
  float fStack_110c;
  float local_1108;
  float fStack_1104;
  float fStack_1100;
  float fStack_10fc;
  float local_10f8;
  float fStack_10f4;
  float fStack_10f0;
  float fStack_10ec;
  float local_10e8;
  float fStack_10e4;
  float fStack_10e0;
  float fStack_10dc;
  float local_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  float local_10c8;
  float fStack_10c4;
  float fStack_10c0;
  float fStack_10bc;
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  undefined1 local_1088 [16];
  undefined1 local_1078 [16];
  undefined1 local_1068 [16];
  undefined1 local_1058 [16];
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  undefined1 local_1028 [16];
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 != 8) {
    pauVar36 = (undefined1 (*) [16])local_f68;
    uStack_f70 = 0;
    fVar63 = (ray->super_RayK<1>).org.field_0.m128[0];
    fVar75 = (ray->super_RayK<1>).org.field_0.m128[1];
    fVar76 = (ray->super_RayK<1>).org.field_0.m128[2];
    fVar77 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
    aVar12 = (ray->super_RayK<1>).dir.field_0.field_1;
    fVar137 = (ray->super_RayK<1>).tfar;
    fVar62 = 0.0;
    if (0.0 <= fVar137) {
      fVar62 = fVar137;
    }
    uVar50 = -(uint)(1e-18 <= ABS(aVar12.x));
    uVar51 = -(uint)(1e-18 <= ABS(aVar12.y));
    uVar54 = -(uint)(1e-18 <= ABS(aVar12.z));
    uVar58 = -(uint)(1e-18 <= ABS(aVar12.field_3.w));
    auVar107 = divps(_DAT_01f7ba10,(undefined1  [16])aVar12);
    auVar86._0_4_ = auVar107._0_4_ & uVar50;
    auVar86._4_4_ = auVar107._4_4_ & uVar51;
    auVar86._8_4_ = auVar107._8_4_ & uVar54;
    auVar86._12_4_ = auVar107._12_4_ & uVar58;
    auVar107._0_8_ = CONCAT44(~uVar51,~uVar50) & 0x5d5e0b6b5d5e0b6b;
    auVar107._8_4_ = ~uVar54 & 0x5d5e0b6b;
    auVar107._12_4_ = ~uVar58 & 0x5d5e0b6b;
    auVar107 = auVar107 | auVar86;
    fVar146 = auVar107._0_4_ * 0.99999964;
    fVar148 = auVar107._4_4_ * 0.99999964;
    fVar150 = auVar107._8_4_ * 0.99999964;
    fVar135 = auVar107._0_4_ * 1.0000004;
    fVar137 = auVar107._4_4_ * 1.0000004;
    fVar139 = auVar107._8_4_ * 1.0000004;
    fVar78 = 0.0;
    if (0.0 <= fVar77) {
      fVar78 = fVar77;
    }
    uVar43 = (ulong)(fVar146 < 0.0) << 4;
    uVar45 = (ulong)(fVar148 < 0.0) << 4 | 0x20;
    uVar48 = (ulong)(fVar150 < 0.0) << 4 | 0x40;
    uVar47 = uVar43 ^ 0x10;
    uVar42 = uVar48 ^ 0x10;
    auVar133._4_4_ = fVar62;
    auVar133._0_4_ = fVar62;
    auVar133._8_4_ = fVar62;
    auVar133._12_4_ = fVar62;
    auVar97._8_4_ = 0xffffffff;
    auVar97._0_8_ = 0xffffffffffffffff;
    auVar97._12_4_ = 0xffffffff;
    local_1058 = mm_lookupmask_ps._0_16_;
    local_1088 = mm_lookupmask_ps._0_16_ ^ auVar97;
    local_1068 = mm_lookupmask_ps._240_16_;
    local_1078 = auVar97 ^ mm_lookupmask_ps._240_16_;
    local_13fc._12_8_ = context;
    local_13fc._4_8_ = ray;
    local_13c0 = uVar43;
    local_1310 = uVar48;
    local_1098 = fVar76;
    fStack_1094 = fVar76;
    fStack_1090 = fVar76;
    fStack_108c = fVar76;
    local_10a8 = fVar139;
    fStack_10a4 = fVar139;
    fStack_10a0 = fVar139;
    fStack_109c = fVar139;
    local_10b8 = fVar78;
    fStack_10b4 = fVar78;
    fStack_10b0 = fVar78;
    fStack_10ac = fVar78;
    local_10c8 = fVar150;
    fStack_10c4 = fVar150;
    fStack_10c0 = fVar150;
    fStack_10bc = fVar150;
    local_10d8 = fVar63;
    fStack_10d4 = fVar63;
    fStack_10d0 = fVar63;
    fStack_10cc = fVar63;
    local_10e8 = fVar75;
    fStack_10e4 = fVar75;
    fStack_10e0 = fVar75;
    fStack_10dc = fVar75;
    local_1178 = fVar146;
    fStack_1174 = fVar146;
    fStack_1170 = fVar146;
    fStack_116c = fVar146;
    local_1188 = fVar148;
    fStack_1184 = fVar148;
    fStack_1180 = fVar148;
    fStack_117c = fVar148;
    local_10f8 = fVar135;
    fStack_10f4 = fVar135;
    fStack_10f0 = fVar135;
    fStack_10ec = fVar135;
    local_11e8 = fVar137;
    fStack_11e4 = fVar137;
    fStack_11e0 = fVar137;
    fStack_11dc = fVar137;
    local_1318 = uVar47;
    fVar62 = fVar137;
    fVar77 = fVar137;
    fVar83 = fVar137;
    fVar93 = fVar146;
    fVar104 = fVar146;
    fVar105 = fVar146;
    fVar106 = fVar148;
    fVar116 = fVar148;
    fVar119 = fVar148;
    fVar156 = fVar150;
    fVar155 = fVar150;
    fVar154 = fVar150;
    fVar153 = fVar139;
    fVar152 = fVar139;
    fVar151 = fVar139;
    fVar149 = fVar76;
    fVar145 = fVar76;
    fVar144 = fVar76;
    fVar143 = fVar135;
    fVar142 = fVar135;
    fVar141 = fVar135;
    fVar140 = fVar75;
    fVar138 = fVar75;
    fVar136 = fVar75;
    fVar129 = fVar63;
    fVar128 = fVar63;
    fVar127 = fVar63;
    fVar122 = fVar78;
    fVar121 = fVar78;
    fVar120 = fVar78;
    pRVar46 = context;
LAB_00d119a3:
    do {
      pauVar32 = pauVar36 + -1;
      pauVar36 = pauVar36 + -1;
      pfVar11 = &(ray->super_RayK<1>).tfar;
      if (*(float *)((long)*pauVar32 + 8) < *pfVar11 || *(float *)((long)*pauVar32 + 8) == *pfVar11)
      {
        uVar14 = *(ulong *)*pauVar36;
        while ((uVar14 & 8) == 0) {
          pfVar11 = (float *)(uVar14 + 0x20 + uVar43);
          auVar118._0_4_ = (*pfVar11 - fVar127) * fVar146;
          auVar118._4_4_ = (pfVar11[1] - fVar128) * fVar93;
          auVar118._8_4_ = (pfVar11[2] - fVar129) * fVar104;
          auVar118._12_4_ = (pfVar11[3] - fVar63) * fVar105;
          pfVar11 = (float *)(uVar14 + 0x20 + uVar45);
          auVar84._0_4_ = (*pfVar11 - fVar136) * fVar148;
          auVar84._4_4_ = (pfVar11[1] - fVar138) * fVar106;
          auVar84._8_4_ = (pfVar11[2] - fVar140) * fVar116;
          auVar84._12_4_ = (pfVar11[3] - fVar75) * fVar119;
          auVar107 = maxps(auVar118,auVar84);
          pfVar11 = (float *)(uVar14 + 0x20 + uVar48);
          auVar85._0_4_ = (*pfVar11 - fVar144) * fVar154;
          auVar85._4_4_ = (pfVar11[1] - fVar145) * fVar155;
          auVar85._8_4_ = (pfVar11[2] - fVar149) * fVar156;
          auVar85._12_4_ = (pfVar11[3] - fVar76) * fVar150;
          auVar111._4_4_ = fVar121;
          auVar111._0_4_ = fVar120;
          auVar111._8_4_ = fVar122;
          auVar111._12_4_ = fVar78;
          auVar86 = maxps(auVar85,auVar111);
          _local_12c8 = maxps(auVar107,auVar86);
          pfVar11 = (float *)(uVar14 + 0x20 + uVar47);
          auVar87._0_4_ = (*pfVar11 - fVar127) * fVar141;
          auVar87._4_4_ = (pfVar11[1] - fVar128) * fVar142;
          auVar87._8_4_ = (pfVar11[2] - fVar129) * fVar143;
          auVar87._12_4_ = (pfVar11[3] - fVar63) * fVar135;
          pfVar11 = (float *)(uVar14 + 0x20 + (uVar45 ^ 0x10));
          auVar94._0_4_ = (*pfVar11 - fVar136) * fVar137;
          auVar94._4_4_ = (pfVar11[1] - fVar138) * fVar62;
          auVar94._8_4_ = (pfVar11[2] - fVar140) * fVar77;
          auVar94._12_4_ = (pfVar11[3] - fVar75) * fVar83;
          auVar107 = minps(auVar87,auVar94);
          pfVar11 = (float *)(uVar14 + 0x20 + uVar42);
          auVar95._0_4_ = (*pfVar11 - fVar144) * fVar151;
          auVar95._4_4_ = (pfVar11[1] - fVar145) * fVar152;
          auVar95._8_4_ = (pfVar11[2] - fVar149) * fVar153;
          auVar95._12_4_ = (pfVar11[3] - fVar76) * fVar139;
          auVar86 = minps(auVar95,auVar133);
          auVar107 = minps(auVar107,auVar86);
          auVar124._4_4_ = -(uint)(local_12c8._4_4_ <= auVar107._4_4_);
          auVar124._0_4_ = -(uint)(local_12c8._0_4_ <= auVar107._0_4_);
          auVar124._8_4_ = -(uint)(local_12c8._8_4_ <= auVar107._8_4_);
          auVar124._12_4_ = -(uint)(local_12c8._12_4_ <= auVar107._12_4_);
          uVar50 = movmskps((int)context,auVar124);
          context = (RayQueryContext *)(ulong)uVar50;
          if (uVar50 == 0) {
            if (pauVar36 == (undefined1 (*) [16])&local_f78) {
              return;
            }
            goto LAB_00d119a3;
          }
          uVar40 = uVar14 & 0xfffffffffffffff0;
          context = (RayQueryContext *)0x0;
          if ((byte)uVar50 != 0) {
            for (; ((byte)uVar50 >> (long)context & 1) == 0;
                context = (RayQueryContext *)
                          ((long)&(((Geometry *)context)->super_RefCount)._vptr_RefCount + 1)) {
            }
          }
          uVar14 = *(ulong *)(uVar40 + (long)context * 8);
          uVar50 = (uVar50 & 0xff) - 1 & uVar50 & 0xff;
          if (uVar50 != 0) {
            uVar51 = *(uint *)(local_12c8 + (long)context * 4);
            lVar10 = 0;
            if (uVar50 != 0) {
              for (; (uVar50 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
              }
            }
            uVar15 = *(ulong *)(uVar40 + lVar10 * 8);
            uVar54 = *(uint *)(local_12c8 + lVar10 * 4);
            uVar50 = uVar50 - 1 & uVar50;
            context = (RayQueryContext *)(ulong)uVar50;
            uVar43 = local_13c0;
            if (uVar50 == 0) {
              if (uVar51 < uVar54) {
                *(ulong *)*pauVar36 = uVar15;
                *(uint *)((long)*pauVar36 + 8) = uVar54;
                pauVar36 = pauVar36 + 1;
              }
              else {
                *(ulong *)*pauVar36 = uVar14;
                *(uint *)((long)*pauVar36 + 8) = uVar51;
                pauVar36 = pauVar36 + 1;
                uVar14 = uVar15;
              }
            }
            else {
              auVar79._8_4_ = uVar51;
              auVar79._0_8_ = uVar14;
              auVar79._12_4_ = 0;
              auVar88._8_4_ = uVar54;
              auVar88._0_8_ = uVar15;
              auVar88._12_4_ = 0;
              lVar10 = 0;
              if ((Geometry *)context != (Geometry *)0x0) {
                for (; (uVar50 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
                }
              }
              uVar14 = *(ulong *)(uVar40 + lVar10 * 8);
              iVar34 = *(int *)(local_12c8 + lVar10 * 4);
              auVar96._8_4_ = iVar34;
              auVar96._0_8_ = uVar14;
              auVar96._12_4_ = 0;
              auVar108._8_4_ = -(uint)((int)uVar51 < (int)uVar54);
              uVar50 = uVar50 - 1 & uVar50;
              fVar62 = fStack_11e4;
              fVar77 = fStack_11e0;
              fVar83 = fStack_11dc;
              fVar137 = local_11e8;
              if (uVar50 == 0) {
                auVar108._4_4_ = auVar108._8_4_;
                auVar108._0_4_ = auVar108._8_4_;
                auVar108._12_4_ = auVar108._8_4_;
                auVar107 = auVar79 & auVar108 | ~auVar108 & auVar88;
                auVar86 = auVar88 & auVar108 | ~auVar108 & auVar79;
                auVar109._8_4_ = -(uint)(auVar107._8_4_ < iVar34);
                auVar109._0_8_ = CONCAT44(auVar109._8_4_,auVar109._8_4_);
                auVar109._12_4_ = auVar109._8_4_;
                auVar97 = auVar96 & auVar109 | ~auVar109 & auVar107;
                auVar80._8_4_ = -(uint)(auVar86._8_4_ < auVar97._8_4_);
                auVar80._4_4_ = auVar80._8_4_;
                auVar80._0_4_ = auVar80._8_4_;
                auVar80._12_4_ = auVar80._8_4_;
                *pauVar36 = ~auVar80 & auVar86 | auVar97 & auVar80;
                pauVar36[1] = auVar86 & auVar80 | ~auVar80 & auVar97;
                pauVar36 = pauVar36 + 2;
                uVar14 = ~auVar109._0_8_ & uVar14 | auVar107._0_8_ & auVar109._0_8_;
              }
              else {
                context = (RayQueryContext *)0x0;
                if (uVar50 != 0) {
                  for (; (uVar50 >> (long)context & 1) == 0;
                      context = (RayQueryContext *)
                                ((long)&(((Geometry *)context)->super_RefCount)._vptr_RefCount + 1))
                  {
                  }
                }
                iVar13 = *(int *)(local_12c8 + (long)context * 4);
                auVar117._8_4_ = iVar13;
                auVar117._0_8_ = *(undefined8 *)(uVar40 + (long)context * 8);
                auVar117._12_4_ = 0;
                auVar110._4_4_ = auVar108._8_4_;
                auVar110._0_4_ = auVar108._8_4_;
                auVar110._8_4_ = auVar108._8_4_;
                auVar110._12_4_ = auVar108._8_4_;
                auVar107 = auVar79 & auVar110 | ~auVar110 & auVar88;
                auVar86 = auVar88 & auVar110 | ~auVar110 & auVar79;
                auVar123._0_4_ = -(uint)(iVar34 < iVar13);
                auVar123._4_4_ = -(uint)(iVar34 < iVar13);
                auVar123._8_4_ = -(uint)(iVar34 < iVar13);
                auVar123._12_4_ = -(uint)(iVar34 < iVar13);
                auVar111 = auVar96 & auVar123 | ~auVar123 & auVar117;
                auVar124 = ~auVar123 & auVar96 | auVar117 & auVar123;
                auVar98._8_4_ = -(uint)(auVar86._8_4_ < auVar124._8_4_);
                auVar98._4_4_ = auVar98._8_4_;
                auVar98._0_4_ = auVar98._8_4_;
                auVar98._12_4_ = auVar98._8_4_;
                auVar118 = auVar86 & auVar98 | ~auVar98 & auVar124;
                auVar89._8_4_ = -(uint)(auVar107._8_4_ < auVar111._8_4_);
                auVar89._0_8_ = CONCAT44(auVar89._8_4_,auVar89._8_4_);
                auVar89._12_4_ = auVar89._8_4_;
                auVar97 = ~auVar89 & auVar107 | auVar111 & auVar89;
                auVar81._8_4_ = -(uint)(auVar97._8_4_ < auVar118._8_4_);
                auVar81._4_4_ = auVar81._8_4_;
                auVar81._0_4_ = auVar81._8_4_;
                auVar81._12_4_ = auVar81._8_4_;
                *pauVar36 = ~auVar98 & auVar86 | auVar124 & auVar98;
                pauVar36[1] = ~auVar81 & auVar97 | auVar118 & auVar81;
                pauVar36[2] = auVar97 & auVar81 | ~auVar81 & auVar118;
                pauVar36 = pauVar36 + 3;
                uVar14 = auVar107._0_8_ & auVar89._0_8_ | ~auVar89._0_8_ & auVar111._0_8_;
                fVar146 = local_1178;
                fVar93 = fStack_1174;
                fVar104 = fStack_1170;
                fVar105 = fStack_116c;
                fVar148 = local_1188;
                fVar106 = fStack_1184;
                fVar116 = fStack_1180;
                fVar119 = fStack_117c;
              }
            }
          }
        }
        local_11a0 = (ulong)((uint)uVar14 & 0xf) - 8;
        if (local_11a0 != 0) {
          local_1198 = 0;
          do {
            lVar37 = local_1198 * 0x60;
            puVar1 = (uint *)((uVar14 & 0xfffffffffffffff0) + lVar37);
            puVar44 = puVar1 + 0x10;
            local_1190 = pRVar46->scene;
            ppfVar16 = (pRVar46->scene->vertices).items;
            pfVar17 = ppfVar16[*puVar44];
            pfVar11 = pfVar17 + *puVar1;
            uVar31 = *(undefined8 *)(pfVar17 + puVar1[4]);
            uStack_1370 = *(undefined8 *)(pfVar17 + puVar1[4] + 2);
            uVar33 = uStack_1370;
            pfVar2 = pfVar17 + puVar1[0xc];
            pfVar18 = ppfVar16[puVar1[0x11]];
            pfVar3 = pfVar18 + puVar1[1];
            pfVar4 = pfVar18 + puVar1[5];
            pfVar5 = pfVar18 + puVar1[0xd];
            pfVar19 = ppfVar16[puVar1[0x12]];
            pfVar6 = pfVar19 + puVar1[10];
            pfVar7 = pfVar19 + puVar1[0xe];
            pfVar20 = ppfVar16[puVar1[0x13]];
            pfVar8 = pfVar20 + puVar1[0xb];
            context = (RayQueryContext *)(ulong)puVar1[0xf];
            pfVar9 = pfVar20 + (long)context;
            local_1378._0_4_ = (float)uVar31;
            local_1148 = (float)local_1378;
            local_1378._4_4_ = (float)((ulong)uVar31 >> 0x20);
            local_ff8 = local_1378._4_4_;
            local_1378 = CONCAT44(pfVar4[2],(float)uStack_1370);
            local_1368 = pfVar19[(ulong)puVar1[6] + 2];
            local_1364 = pfVar20[(ulong)puVar1[7] + 2];
            local_1158 = CONCAT44(*pfVar4,local_1148);
            fStack_11a8 = pfVar6[2];
            fStack_11a4 = pfVar8[2];
            local_11c8 = CONCAT44(pfVar18[puVar1[9]],pfVar17[puVar1[8]]);
            local_11b8 = *pfVar6;
            fStack_11b4 = *pfVar8;
            local_11d8 = (pfVar17 + puVar1[8])[1];
            fStack_11d4 = (pfVar18 + puVar1[9])[1];
            fStack_11d0 = pfVar6[1];
            fStack_11cc = pfVar8[1];
            local_1338 = (ray->super_RayK<1>).org.field_0.m128[0];
            local_12e8._4_4_ = (ray->super_RayK<1>).org.field_0.m128[1];
            fVar137 = (ray->super_RayK<1>).org.field_0.m128[2];
            local_f88 = pfVar11[1] - (float)local_12e8._4_4_;
            fStack_f84 = pfVar3[1] - (float)local_12e8._4_4_;
            fStack_f80 = pfVar19[(ulong)puVar1[2] + 1] - (float)local_12e8._4_4_;
            fStack_f7c = pfVar20[(ulong)puVar1[3] + 1] - (float)local_12e8._4_4_;
            fVar62 = pfVar11[2] - fVar137;
            fVar75 = pfVar3[2] - fVar137;
            fVar77 = pfVar19[(ulong)puVar1[2] + 2] - fVar137;
            fVar148 = pfVar20[(ulong)puVar1[3] + 2] - fVar137;
            local_1008 = pfVar2[1];
            fStack_1004 = pfVar5[1];
            fStack_1000 = pfVar7[1];
            fStack_ffc = pfVar9[1];
            local_1328 = pfVar2[1] - (float)local_12e8._4_4_;
            fStack_1324 = pfVar5[1] - (float)local_12e8._4_4_;
            fStack_1320 = pfVar7[1] - (float)local_12e8._4_4_;
            fStack_131c = pfVar9[1] - (float)local_12e8._4_4_;
            local_fe8 = pfVar2[2];
            fStack_fe4 = pfVar5[2];
            fStack_fe0 = pfVar7[2];
            fStack_fdc = pfVar9[2];
            local_12d8 = pfVar2[2] - fVar137;
            fStack_12d4 = pfVar5[2] - fVar137;
            fStack_12d0 = pfVar7[2] - fVar137;
            fStack_12cc = pfVar9[2] - fVar137;
            local_fa8 = local_1328 - local_f88;
            fStack_fa4 = fStack_1324 - fStack_f84;
            fStack_fa0 = fStack_1320 - fStack_f80;
            fStack_f9c = fStack_131c - fStack_f7c;
            local_f98 = local_12d8 - fVar62;
            fStack_f94 = fStack_12d4 - fVar75;
            fStack_f90 = fStack_12d0 - fVar77;
            fStack_f8c = fStack_12cc - fVar148;
            fStack_1334 = local_1338;
            fStack_1330 = local_1338;
            fStack_132c = local_1338;
            fVar122 = *pfVar11 - local_1338;
            fVar127 = *pfVar3 - local_1338;
            fVar128 = fStack_1440 - local_1338;
            fVar129 = fStack_143c - local_1338;
            local_1018 = *pfVar2;
            fStack_1014 = *pfVar5;
            fStack_1010 = *pfVar7;
            fStack_100c = *pfVar9;
            local_12f8 = *pfVar2 - local_1338;
            fStack_12f4 = *pfVar5 - local_1338;
            fStack_12f0 = *pfVar7 - local_1338;
            fStack_12ec = *pfVar9 - local_1338;
            local_fb8 = local_12f8 - fVar122;
            fStack_fb4 = fStack_12f4 - fVar127;
            fStack_fb0 = fStack_12f0 - fVar128;
            fStack_fac = fStack_12ec - fVar129;
            fStack_1434 = (ray->super_RayK<1>).dir.field_0.m128[0];
            local_13b8._4_4_ = (ray->super_RayK<1>).dir.field_0.m128[1];
            fStack_13e4 = (ray->super_RayK<1>).dir.field_0.m128[2];
            local_1038 = (local_fa8 * (local_12d8 + fVar62) - local_f98 * (local_1328 + local_f88))
                         * fStack_1434 +
                         (local_f98 * (local_12f8 + fVar122) - (local_12d8 + fVar62) * local_fb8) *
                         local_13b8._4_4_ +
                         ((local_1328 + local_f88) * local_fb8 - (local_12f8 + fVar122) * local_fa8)
                         * fStack_13e4;
            fStack_1034 = (fStack_fa4 * (fStack_12d4 + fVar75) -
                          fStack_f94 * (fStack_1324 + fStack_f84)) * fStack_1434 +
                          (fStack_f94 * (fStack_12f4 + fVar127) -
                          (fStack_12d4 + fVar75) * fStack_fb4) * local_13b8._4_4_ +
                          ((fStack_1324 + fStack_f84) * fStack_fb4 -
                          (fStack_12f4 + fVar127) * fStack_fa4) * fStack_13e4;
            fStack_1030 = (fStack_fa0 * (fStack_12d0 + fVar77) -
                          fStack_f90 * (fStack_1320 + fStack_f80)) * fStack_1434 +
                          (fStack_f90 * (fStack_12f0 + fVar128) -
                          (fStack_12d0 + fVar77) * fStack_fb0) * local_13b8._4_4_ +
                          ((fStack_1320 + fStack_f80) * fStack_fb0 -
                          (fStack_12f0 + fVar128) * fStack_fa0) * fStack_13e4;
            fStack_102c = (fStack_f9c * (fStack_12cc + fVar148) -
                          fStack_f8c * (fStack_131c + fStack_f7c)) * fStack_1434 +
                          (fStack_f8c * (fStack_12ec + fVar129) -
                          (fStack_12cc + fVar148) * fStack_fac) * local_13b8._4_4_ +
                          ((fStack_131c + fStack_f7c) * fStack_fac -
                          (fStack_12ec + fVar129) * fStack_f9c) * fStack_13e4;
            fStack_ff4 = pfVar4[1];
            fStack_ff0 = pfVar19[(ulong)puVar1[6] + 1];
            fStack_fec = pfVar20[(ulong)puVar1[7] + 1];
            local_12e8._0_4_ = local_12e8._4_4_;
            fStack_12e0 = (float)local_12e8._4_4_;
            fStack_12dc = (float)local_12e8._4_4_;
            local_1128 = local_ff8 - (float)local_12e8._4_4_;
            fStack_1124 = pfVar4[1] - (float)local_12e8._4_4_;
            fStack_1120 = pfVar19[(ulong)puVar1[6] + 1] - (float)local_12e8._4_4_;
            fStack_111c = pfVar20[(ulong)puVar1[7] + 1] - (float)local_12e8._4_4_;
            uStack_1370._4_4_ = (float)((ulong)uStack_1370 >> 0x20);
            local_1168 = fVar137;
            fStack_1164 = fVar137;
            fStack_1160 = fVar137;
            fStack_115c = fVar137;
            local_1138 = (float)uStack_1370 - fVar137;
            fStack_1134 = pfVar4[2] - fVar137;
            fStack_1130 = (float)uStack_1370 - fVar137;
            fStack_112c = uStack_1370._4_4_ - fVar137;
            fVar116 = local_f88 - local_1128;
            fVar119 = fStack_f84 - fStack_1124;
            fVar120 = fStack_f80 - fStack_1120;
            fVar121 = fStack_f7c - fStack_111c;
            local_fd8 = fVar62 - local_1138;
            fStack_fd4 = fVar75 - fStack_1134;
            fStack_fd0 = fVar77 - fStack_1130;
            fStack_fcc = fVar148 - fStack_112c;
            local_1148 = local_1148 - local_1338;
            fStack_1144 = *pfVar4 - local_1338;
            fStack_1140 = fStack_1150 - local_1338;
            fStack_113c = fStack_114c - local_1338;
            fVar136 = fVar122 - local_1148;
            fVar138 = fVar127 - fStack_1144;
            fVar140 = fVar128 - fStack_1140;
            fVar141 = fVar129 - fStack_113c;
            local_1028._0_4_ =
                 (fVar116 * (fVar62 + local_1138) - local_fd8 * (local_f88 + local_1128)) *
                 fStack_1434 +
                 (local_fd8 * (fVar122 + local_1148) - (fVar62 + local_1138) * fVar136) *
                 local_13b8._4_4_ +
                 ((local_f88 + local_1128) * fVar136 - (fVar122 + local_1148) * fVar116) *
                 fStack_13e4;
            local_1028._4_4_ =
                 (fVar119 * (fVar75 + fStack_1134) - fStack_fd4 * (fStack_f84 + fStack_1124)) *
                 fStack_1434 +
                 (fStack_fd4 * (fVar127 + fStack_1144) - (fVar75 + fStack_1134) * fVar138) *
                 local_13b8._4_4_ +
                 ((fStack_f84 + fStack_1124) * fVar138 - (fVar127 + fStack_1144) * fVar119) *
                 fStack_13e4;
            local_1028._8_4_ =
                 (fVar120 * (fVar77 + fStack_1130) - fStack_fd0 * (fStack_f80 + fStack_1120)) *
                 fStack_1434 +
                 (fStack_fd0 * (fVar128 + fStack_1140) - (fVar77 + fStack_1130) * fVar140) *
                 local_13b8._4_4_ +
                 ((fStack_f80 + fStack_1120) * fVar140 - (fVar128 + fStack_1140) * fVar120) *
                 fStack_13e4;
            local_1028._12_4_ =
                 (fVar121 * (fVar148 + fStack_112c) - fStack_fcc * (fStack_f7c + fStack_111c)) *
                 fStack_1434 +
                 (fStack_fcc * (fVar129 + fStack_113c) - (fVar148 + fStack_112c) * fVar141) *
                 local_13b8._4_4_ +
                 ((fStack_f7c + fStack_111c) * fVar141 - (fVar129 + fStack_113c) * fVar121) *
                 fStack_13e4;
            local_fc8 = local_1128 - local_1328;
            fStack_fc4 = fStack_1124 - fStack_1324;
            fStack_fc0 = fStack_1120 - fStack_1320;
            fStack_fbc = fStack_111c - fStack_131c;
            fVar93 = local_1138 - local_12d8;
            fVar104 = fStack_1134 - fStack_12d4;
            fVar105 = fStack_1130 - fStack_12d0;
            fVar106 = fStack_112c - fStack_12cc;
            local_1118 = local_1128 + local_1328;
            fStack_1114 = fStack_1124 + fStack_1324;
            fStack_1110 = fStack_1120 + fStack_1320;
            fStack_110c = fStack_111c + fStack_131c;
            local_1308._0_4_ = local_1138 + local_12d8;
            local_1308._4_4_ = fStack_1134 + fStack_12d4;
            fStack_1300 = fStack_1130 + fStack_12d0;
            fStack_12fc = fStack_112c + fStack_12cc;
            fVar142 = local_1148 - local_12f8;
            fVar143 = fStack_1144 - fStack_12f4;
            fVar144 = fStack_1140 - fStack_12f0;
            fVar145 = fStack_113c - fStack_12ec;
            local_1108 = local_1148 + local_12f8;
            fStack_1104 = fStack_1144 + fStack_12f4;
            fStack_1100 = fStack_1140 + fStack_12f0;
            fStack_10fc = fStack_113c + fStack_12ec;
            local_13e8 = fStack_13e4;
            uStack_13e0 = fStack_13e4;
            fStack_13dc = fStack_13e4;
            local_13b8._0_4_ = (uint)local_13b8._4_4_;
            auStack_13b0[0] = (uint)local_13b8._4_4_;
            auStack_13ac[0] = (uint)local_13b8._4_4_;
            auVar82._0_4_ =
                 (local_fc8 * (float)local_1308._0_4_ - fVar93 * local_1118) * fStack_1434 +
                 (fVar93 * local_1108 - fVar142 * (float)local_1308._0_4_) * local_13b8._4_4_ +
                 (fVar142 * local_1118 - local_fc8 * local_1108) * fStack_13e4;
            auVar82._4_4_ =
                 (fStack_fc4 * (float)local_1308._4_4_ - fVar104 * fStack_1114) * fStack_1434 +
                 (fVar104 * fStack_1104 - fVar143 * (float)local_1308._4_4_) * local_13b8._4_4_ +
                 (fVar143 * fStack_1114 - fStack_fc4 * fStack_1104) * fStack_13e4;
            auVar82._8_4_ =
                 (fStack_fc0 * fStack_1300 - fVar105 * fStack_1110) * fStack_1434 +
                 (fVar105 * fStack_1100 - fVar144 * fStack_1300) * local_13b8._4_4_ +
                 (fVar144 * fStack_1110 - fStack_fc0 * fStack_1100) * fStack_13e4;
            auVar82._12_4_ =
                 (fStack_fbc * fStack_12fc - fVar106 * fStack_110c) * fStack_1434 +
                 (fVar106 * fStack_10fc - fVar145 * fStack_12fc) * local_13b8._4_4_ +
                 (fVar145 * fStack_110c - fStack_fbc * fStack_10fc) * fStack_13e4;
            fVar63 = local_1038 + local_1028._0_4_ + auVar82._0_4_;
            fVar76 = fStack_1034 + local_1028._4_4_ + auVar82._4_4_;
            fVar146 = fStack_1030 + local_1028._8_4_ + auVar82._8_4_;
            fVar78 = fStack_102c + local_1028._12_4_ + auVar82._12_4_;
            auVar112._4_4_ = fStack_1034;
            auVar112._0_4_ = local_1038;
            auVar112._8_4_ = fStack_1030;
            auVar112._12_4_ = fStack_102c;
            auVar107 = minps(auVar112,local_1028);
            auVar107 = minps(auVar107,auVar82);
            auVar130._4_4_ = fStack_1034;
            auVar130._0_4_ = local_1038;
            auVar130._8_4_ = fStack_1030;
            auVar130._12_4_ = fStack_102c;
            auVar86 = maxps(auVar130,local_1028);
            auVar86 = maxps(auVar86,auVar82);
            fVar135 = ABS(fVar63) * 1.1920929e-07;
            fVar139 = ABS(fVar76) * 1.1920929e-07;
            fVar150 = ABS(fVar146) * 1.1920929e-07;
            fVar83 = ABS(fVar78) * 1.1920929e-07;
            auVar131._4_4_ = -(uint)(auVar86._4_4_ <= fVar139);
            auVar131._0_4_ = -(uint)(auVar86._0_4_ <= fVar135);
            auVar131._8_4_ = -(uint)(auVar86._8_4_ <= fVar150);
            auVar131._12_4_ = -(uint)(auVar86._12_4_ <= fVar83);
            auVar113._4_4_ = -(uint)(-fVar139 <= auVar107._4_4_);
            auVar113._0_4_ = -(uint)(-fVar135 <= auVar107._0_4_);
            auVar113._8_4_ = -(uint)(-fVar150 <= auVar107._8_4_);
            auVar113._12_4_ = -(uint)(-fVar83 <= auVar107._12_4_);
            auVar131 = auVar131 | auVar113;
            lVar10 = (uVar14 & 0xfffffffffffffff0) + lVar37;
            uVar39 = (undefined4)((ulong)lVar37 >> 0x20);
            iVar34 = movmskps((int)lVar37,auVar131);
            if (iVar34 == 0) {
              uVar50 = 0;
            }
            else {
              local_1048 = fVar63;
              fStack_1044 = fVar76;
              fStack_1040 = fVar146;
              fStack_103c = fVar78;
              uVar50 = -(uint)(ABS(local_fd8 * local_fc8) <= ABS(local_f98 * fVar116));
              uVar58 = -(uint)(ABS(fStack_fd4 * fStack_fc4) <= ABS(fStack_f94 * fVar119));
              uVar55 = -(uint)(ABS(fStack_fd0 * fStack_fc0) <= ABS(fStack_f90 * fVar120));
              uVar59 = -(uint)(ABS(fStack_fcc * fStack_fbc) <= ABS(fStack_f8c * fVar121));
              uVar51 = -(uint)(ABS(fVar136 * fVar93) <= ABS(local_fb8 * local_fd8));
              uVar52 = -(uint)(ABS(fVar138 * fVar104) <= ABS(fStack_fb4 * fStack_fd4));
              uVar56 = -(uint)(ABS(fVar140 * fVar105) <= ABS(fStack_fb0 * fStack_fd0));
              uVar60 = -(uint)(ABS(fVar141 * fVar106) <= ABS(fStack_fac * fStack_fcc));
              uVar54 = -(uint)(ABS(fVar116 * fVar142) <= ABS(local_fa8 * fVar136));
              uVar53 = -(uint)(ABS(fVar119 * fVar143) <= ABS(fStack_fa4 * fVar138));
              uVar57 = -(uint)(ABS(fVar120 * fVar144) <= ABS(fStack_fa0 * fVar140));
              uVar61 = -(uint)(ABS(fVar121 * fVar145) <= ABS(fStack_f9c * fVar141));
              local_1298._0_4_ =
                   ~uVar50 & (uint)(local_fa8 * local_fd8 - local_f98 * fVar116) |
                   (uint)(fVar116 * fVar93 - local_fd8 * local_fc8) & uVar50;
              local_1298._4_4_ =
                   ~uVar58 & (uint)(fStack_fa4 * fStack_fd4 - fStack_f94 * fVar119) |
                   (uint)(fVar119 * fVar104 - fStack_fd4 * fStack_fc4) & uVar58;
              fStack_1290 = (float)(~uVar55 & (uint)(fStack_fa0 * fStack_fd0 - fStack_f90 * fVar120)
                                   | (uint)(fVar120 * fVar105 - fStack_fd0 * fStack_fc0) & uVar55);
              fStack_128c = (float)(~uVar59 & (uint)(fStack_f9c * fStack_fcc - fStack_f8c * fVar121)
                                   | (uint)(fVar121 * fVar106 - fStack_fcc * fStack_fbc) & uVar59);
              local_1288 = (float)(~uVar51 & (uint)(local_f98 * fVar136 - local_fb8 * local_fd8) |
                                  (uint)(local_fd8 * fVar142 - fVar136 * fVar93) & uVar51);
              fStack_1284 = (float)(~uVar52 & (uint)(fStack_f94 * fVar138 - fStack_fb4 * fStack_fd4)
                                   | (uint)(fStack_fd4 * fVar143 - fVar138 * fVar104) & uVar52);
              fStack_1280 = (float)(~uVar56 & (uint)(fStack_f90 * fVar140 - fStack_fb0 * fStack_fd0)
                                   | (uint)(fStack_fd0 * fVar144 - fVar140 * fVar105) & uVar56);
              fStack_127c = (float)(~uVar60 & (uint)(fStack_f8c * fVar141 - fStack_fac * fStack_fcc)
                                   | (uint)(fStack_fcc * fVar145 - fVar141 * fVar106) & uVar60);
              local_1278 = (float)(~uVar54 & (uint)(local_fb8 * fVar116 - local_fa8 * fVar136) |
                                  (uint)(fVar136 * local_fc8 - fVar116 * fVar142) & uVar54);
              fStack_1274 = (float)(~uVar53 & (uint)(fStack_fb4 * fVar119 - fStack_fa4 * fVar138) |
                                   (uint)(fVar138 * fStack_fc4 - fVar119 * fVar143) & uVar53);
              fStack_1270 = (float)(~uVar57 & (uint)(fStack_fb0 * fVar120 - fStack_fa0 * fVar140) |
                                   (uint)(fVar140 * fStack_fc0 - fVar120 * fVar144) & uVar57);
              fStack_126c = (float)(~uVar61 & (uint)(fStack_fac * fVar121 - fStack_f9c * fVar141) |
                                   (uint)(fVar141 * fStack_fbc - fVar121 * fVar145) & uVar61);
              fVar93 = fStack_1434 * (float)local_1298._0_4_ +
                       local_13b8._4_4_ * local_1288 + fStack_13e4 * local_1278;
              fVar104 = fStack_1434 * (float)local_1298._4_4_ +
                        local_13b8._4_4_ * fStack_1284 + fStack_13e4 * fStack_1274;
              fVar105 = fStack_1434 * fStack_1290 +
                        local_13b8._4_4_ * fStack_1280 + fStack_13e4 * fStack_1270;
              fVar106 = fStack_1434 * fStack_128c +
                        local_13b8._4_4_ * fStack_127c + fStack_13e4 * fStack_126c;
              fVar93 = fVar93 + fVar93;
              fVar104 = fVar104 + fVar104;
              fVar105 = fVar105 + fVar105;
              fVar106 = fVar106 + fVar106;
              auVar64._0_4_ = fVar62 * local_1278;
              auVar64._4_4_ = fVar75 * fStack_1274;
              auVar64._8_4_ = fVar77 * fStack_1270;
              auVar64._12_4_ = fVar148 * fStack_126c;
              fVar135 = fVar122 * (float)local_1298._0_4_ + local_f88 * local_1288 + auVar64._0_4_;
              fVar139 = fVar127 * (float)local_1298._4_4_ + fStack_f84 * fStack_1284 + auVar64._4_4_
              ;
              fVar150 = fVar128 * fStack_1290 + fStack_f80 * fStack_1280 + auVar64._8_4_;
              fVar83 = fVar129 * fStack_128c + fStack_f7c * fStack_127c + auVar64._12_4_;
              auVar23._4_4_ = fVar104;
              auVar23._0_4_ = fVar93;
              auVar23._8_4_ = fVar105;
              auVar23._12_4_ = fVar106;
              auVar107 = rcpps(auVar64,auVar23);
              fVar62 = auVar107._0_4_;
              fVar75 = auVar107._4_4_;
              fVar77 = auVar107._8_4_;
              fVar148 = auVar107._12_4_;
              fVar135 = ((1.0 - fVar93 * fVar62) * fVar62 + fVar62) * (fVar135 + fVar135);
              fVar75 = ((1.0 - fVar104 * fVar75) * fVar75 + fVar75) * (fVar139 + fVar139);
              fVar77 = ((1.0 - fVar105 * fVar77) * fVar77 + fVar77) * (fVar150 + fVar150);
              fVar148 = ((1.0 - fVar106 * fVar148) * fVar148 + fVar148) * (fVar83 + fVar83);
              local_1428 = (ray->super_RayK<1>).tfar;
              fVar62 = (ray->super_RayK<1>).org.field_0.m128[3];
              auVar65._4_4_ = -(uint)(fVar62 <= fVar75);
              auVar65._0_4_ = -(uint)(fVar62 <= fVar135);
              auVar65._8_4_ = -(uint)(fVar62 <= fVar77);
              auVar65._12_4_ = -(uint)(fVar62 <= fVar148);
              local_1268 = -(uint)(fVar93 != 0.0) & auVar131._0_4_ &
                           -(uint)(fVar135 <= local_1428 && fVar62 <= fVar135);
              uStack_1264 = -(uint)(fVar104 != 0.0) & auVar131._4_4_ &
                            -(uint)(fVar75 <= local_1428 && fVar62 <= fVar75);
              uStack_1260 = -(uint)(fVar105 != 0.0) & auVar131._8_4_ &
                            -(uint)(fVar77 <= local_1428 && fVar62 <= fVar77);
              uStack_125c = -(uint)(fVar106 != 0.0) & auVar131._12_4_ &
                            -(uint)(fVar148 <= local_1428 && fVar62 <= fVar148);
              auVar24._4_4_ = uStack_1264;
              auVar24._0_4_ = local_1268;
              auVar24._8_4_ = uStack_1260;
              auVar24._12_4_ = uStack_125c;
              uVar50 = movmskps(iVar34,auVar24);
              if (uVar50 != 0) {
                local_12c8._4_4_ = fStack_1034;
                local_12c8._0_4_ = local_1038;
                fStack_12c0 = fStack_1030;
                fStack_12bc = fStack_102c;
                local_12b8 = local_1028._0_4_;
                fStack_12b4 = local_1028._4_4_;
                fStack_12b0 = local_1028._8_4_;
                fStack_12ac = local_1028._12_4_;
                local_12a8._4_4_ = fVar76;
                local_12a8._0_4_ = fVar63;
                local_12a8._8_4_ = fVar146;
                local_12a8._12_4_ = fVar78;
                local_1238[0] = fVar135;
                local_1238[1] = fVar75;
                local_1238[2] = fVar77;
                local_1238[3] = fVar148;
                local_11f8 = local_1058._0_4_;
                uStack_11f4 = local_1058._4_4_;
                uStack_11f0 = local_1058._8_4_;
                uStack_11ec = local_1058._12_4_;
                local_13d8._4_4_ = uStack_1264;
                local_13d8._0_4_ = local_1268;
                local_13d8._8_4_ = uStack_1260;
                local_13d8._12_4_ = uStack_125c;
                auVar107 = rcpps(auVar65,local_12a8);
                fVar137 = auVar107._0_4_;
                fVar62 = auVar107._4_4_;
                fVar139 = auVar107._8_4_;
                fVar150 = auVar107._12_4_;
                fVar104 = DAT_01f7ba10._4_4_;
                fVar105 = DAT_01f7ba10._12_4_;
                fVar83 = (float)DAT_01f7ba10;
                fVar93 = DAT_01f7ba10._8_4_;
                fVar137 = (float)(-(uint)(1e-18 <= ABS(fVar63)) &
                                 (uint)((fVar83 - fVar63 * fVar137) * fVar137 + fVar137));
                fVar62 = (float)(-(uint)(1e-18 <= ABS(fVar76)) &
                                (uint)((fVar104 - fVar76 * fVar62) * fVar62 + fVar62));
                fVar63 = (float)(-(uint)(1e-18 <= ABS(fVar146)) &
                                (uint)((fVar93 - fVar146 * fVar139) * fVar139 + fVar139));
                fVar76 = (float)(-(uint)(1e-18 <= ABS(fVar78)) &
                                (uint)((fVar105 - fVar78 * fVar150) * fVar150 + fVar150));
                auVar147._0_4_ = local_1038 * fVar137;
                auVar147._4_4_ = fStack_1034 * fVar62;
                auVar147._8_4_ = fStack_1030 * fVar63;
                auVar147._12_4_ = fStack_102c * fVar76;
                auVar86 = minps(auVar147,_DAT_01f7ba10);
                auVar134._0_4_ = fVar137 * local_1028._0_4_;
                auVar134._4_4_ = fVar62 * local_1028._4_4_;
                auVar134._8_4_ = fVar63 * local_1028._8_4_;
                auVar134._12_4_ = fVar76 * local_1028._12_4_;
                auVar107 = minps(auVar134,_DAT_01f7ba10);
                local_1258 = (float)((uint)auVar86._0_4_ & local_1088._0_4_ |
                                    (uint)(fVar83 - auVar86._0_4_) & local_1058._0_4_);
                uStack_1254 = (uint)auVar86._4_4_ & local_1088._4_4_ |
                              (uint)(fVar104 - auVar86._4_4_) & local_1058._4_4_;
                uStack_1250 = (uint)auVar86._8_4_ & local_1088._8_4_ |
                              (uint)(fVar93 - auVar86._8_4_) & local_1058._8_4_;
                uStack_124c = (uint)auVar86._12_4_ & local_1088._12_4_ |
                              (uint)(fVar105 - auVar86._12_4_) & local_1058._12_4_;
                local_1248._4_4_ =
                     (uint)auVar107._4_4_ & local_1088._4_4_ |
                     (uint)(fVar104 - auVar107._4_4_) & local_1058._4_4_;
                local_1248._0_4_ =
                     (uint)auVar107._0_4_ & local_1088._0_4_ |
                     (uint)(fVar83 - auVar107._0_4_) & local_1058._0_4_;
                local_1248._8_4_ =
                     (uint)auVar107._8_4_ & local_1088._8_4_ |
                     (uint)(fVar93 - auVar107._8_4_) & local_1058._8_4_;
                local_1248._12_4_ =
                     (uint)auVar107._12_4_ & local_1088._12_4_ |
                     (uint)(fVar105 - auVar107._12_4_) & local_1058._12_4_;
                local_1228._4_4_ = local_1298._4_4_;
                local_1228._0_4_ = local_1298._0_4_;
                fStack_1220 = fStack_1290;
                fStack_121c = fStack_128c;
                local_1218[0] = local_1288;
                local_1218[1] = fStack_1284;
                local_1218[2] = fStack_1280;
                local_1218[3] = fStack_127c;
                local_1208[0] = local_1278;
                local_1208[1] = fStack_1274;
                local_1208[2] = fStack_1270;
                local_1208[3] = fStack_126c;
                auVar66._0_4_ = (uint)fVar135 & local_1268;
                auVar66._4_4_ = (uint)fVar75 & uStack_1264;
                auVar66._8_4_ = (uint)fVar77 & uStack_1260;
                auVar66._12_4_ = (uint)fVar148 & uStack_125c;
                auVar90._0_8_ = CONCAT44(~uStack_1264,~local_1268) & 0x7f8000007f800000;
                auVar90._8_4_ = ~uStack_1260 & 0x7f800000;
                auVar90._12_4_ = ~uStack_125c & 0x7f800000;
                auVar90 = auVar90 | auVar66;
                auVar99._4_4_ = auVar90._0_4_;
                auVar99._0_4_ = auVar90._4_4_;
                auVar99._8_4_ = auVar90._12_4_;
                auVar99._12_4_ = auVar90._8_4_;
                auVar107 = minps(auVar99,auVar90);
                auVar67._0_8_ = auVar107._8_8_;
                auVar67._8_4_ = auVar107._0_4_;
                auVar67._12_4_ = auVar107._4_4_;
                auVar107 = minps(auVar67,auVar107);
                auVar68._0_4_ = -(uint)(auVar107._0_4_ == auVar90._0_4_) & local_1268;
                auVar68._4_4_ = -(uint)(auVar107._4_4_ == auVar90._4_4_) & uStack_1264;
                auVar68._8_4_ = -(uint)(auVar107._8_4_ == auVar90._8_4_) & uStack_1260;
                auVar68._12_4_ = -(uint)(auVar107._12_4_ == auVar90._12_4_) & uStack_125c;
                iVar34 = movmskps(uVar50,auVar68);
                uVar50 = local_1268;
                uVar51 = uStack_1264;
                uVar54 = uStack_1260;
                uVar58 = uStack_125c;
                if (iVar34 != 0) {
                  uVar50 = auVar68._0_4_;
                  uVar51 = auVar68._4_4_;
                  uVar54 = auVar68._8_4_;
                  uVar58 = auVar68._12_4_;
                }
                context = (RayQueryContext *)(ulong)(uint)(ray->super_RayK<1>).mask;
                auVar25._4_4_ = uVar51;
                auVar25._0_4_ = uVar50;
                auVar25._8_4_ = uVar54;
                auVar25._12_4_ = uVar58;
                uVar35 = movmskps(iVar34,auVar25);
                pRVar49 = (RayHit *)0x0;
                uStack_1370 = uVar33;
                if (CONCAT44(uVar39,uVar35) != 0) {
                  for (; (CONCAT44(uVar39,uVar35) >> (long)pRVar49 & 1) == 0;
                      pRVar49 = (RayHit *)((long)(pRVar49->super_RayK<1>).org.field_0.m128 + 1)) {
                  }
                }
LAB_00d124dc:
                uVar50 = puVar44[(long)pRVar49];
                pRVar38 = (RayHit *)(ulong)uVar50;
                pGVar21 = (local_1190->geometries).items[(long)pRVar38].ptr;
                if ((pGVar21->mask & (uint)context) == 0) {
                  *(undefined4 *)(local_13d8 + (long)pRVar49 * 4) = 0;
                  goto LAB_00d12531;
                }
                pRVar22 = pRVar46->args;
                if (pRVar22->filter == (RTCFilterFunctionN)0x0) {
                  pRVar41 = pRVar46->user;
                  if (pGVar21->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                    fVar137 = (&local_1258)[(long)pRVar49];
                    fVar62 = *(float *)(local_1248 + (long)pRVar49 * 4);
                    (ray->super_RayK<1>).tfar = local_1238[(long)pRVar49];
                    (ray->Ng).field_0.field_0.x = *(float *)(local_1228 + (long)pRVar49 * 4);
                    (ray->Ng).field_0.field_0.y = local_1218[(long)pRVar49];
                    (ray->Ng).field_0.field_0.z = local_1208[(long)pRVar49];
                    ray->u = fVar137;
                    ray->v = fVar62;
                    uVar51 = *(uint *)(lVar10 + 0x50 + (long)pRVar49 * 4);
                    context = (RayQueryContext *)(ulong)uVar51;
                    ray->primID = uVar51;
                    ray->geomID = uVar50;
                    ray->instID[0] = pRVar41->instID[0];
                    uVar50 = pRVar41->instPrimID[0];
                    uVar39 = 0;
                    ray->instPrimID[0] = uVar50;
LAB_00d12839:
                    local_1338 = (ray->super_RayK<1>).org.field_0.m128[0];
                    local_12e8._4_4_ = (ray->super_RayK<1>).org.field_0.m128[1];
                    fVar137 = (ray->super_RayK<1>).org.field_0.m128[2];
                    fStack_1434 = (ray->super_RayK<1>).dir.field_0.m128[0];
                    local_13b8._4_4_ = (ray->super_RayK<1>).dir.field_0.m128[1];
                    fStack_13e4 = (ray->super_RayK<1>).dir.field_0.m128[2];
                    local_13e8 = fStack_13e4;
                    uStack_13e0 = fStack_13e4;
                    fStack_13dc = fStack_13e4;
                    local_1328 = local_1008 - (float)local_12e8._4_4_;
                    fStack_1324 = fStack_1004 - (float)local_12e8._4_4_;
                    fStack_1320 = fStack_1000 - (float)local_12e8._4_4_;
                    fStack_131c = fStack_ffc - (float)local_12e8._4_4_;
                    local_12d8 = local_fe8 - fVar137;
                    fStack_12d4 = fStack_fe4 - fVar137;
                    fStack_12d0 = fStack_fe0 - fVar137;
                    fStack_12cc = fStack_fdc - fVar137;
                    local_12e8._0_4_ = local_12e8._4_4_;
                    fStack_12e0 = (float)local_12e8._4_4_;
                    fStack_12dc = (float)local_12e8._4_4_;
                    local_1108 = (local_1018 - local_1338) + ((float)local_1158 - local_1338);
                    fStack_1104 = (fStack_1014 - local_1338) + (local_1158._4_4_ - local_1338);
                    fStack_1100 = (fStack_1010 - local_1338) + (fStack_1150 - local_1338);
                    fStack_10fc = (fStack_100c - local_1338) + (fStack_114c - local_1338);
                    local_1118 = local_1328 + (local_ff8 - (float)local_12e8._4_4_);
                    fStack_1114 = fStack_1324 + (fStack_ff4 - (float)local_12e8._4_4_);
                    fStack_1110 = fStack_1320 + (fStack_ff0 - (float)local_12e8._4_4_);
                    fStack_110c = fStack_131c + (fStack_fec - (float)local_12e8._4_4_);
                    local_1308._4_4_ = fStack_12d4 + (local_1378._4_4_ - fVar137);
                    local_1308._0_4_ = local_12d8 + ((float)local_1378 - fVar137);
                    fStack_1300 = fStack_12d0 + ((float)uStack_1370 - fVar137);
                    fStack_12fc = fStack_12cc + (uStack_1370._4_4_ - fVar137);
                    local_1138 = (float)local_1378 - fVar137;
                    fStack_1134 = local_1378._4_4_ - fVar137;
                    fStack_1130 = (float)uStack_1370 - fVar137;
                    fStack_112c = uStack_1370._4_4_ - fVar137;
                    local_1128 = local_ff8 - (float)local_12e8._4_4_;
                    fStack_1124 = fStack_ff4 - (float)local_12e8._4_4_;
                    fStack_1120 = fStack_ff0 - (float)local_12e8._4_4_;
                    fStack_111c = fStack_fec - (float)local_12e8._4_4_;
                    local_1148 = (float)local_1158 - local_1338;
                    fStack_1144 = local_1158._4_4_ - local_1338;
                    fStack_1140 = fStack_1150 - local_1338;
                    fStack_113c = fStack_114c - local_1338;
                    local_12f8 = local_1018 - local_1338;
                    fStack_12f4 = fStack_1014 - local_1338;
                    fStack_12f0 = fStack_1010 - local_1338;
                    fStack_12ec = fStack_100c - local_1338;
                    uVar48 = local_1310;
                    goto LAB_00d12927;
                  }
                }
                else {
                  pRVar41 = pRVar46->user;
                }
                local_1368 = *(float *)(local_1228 + (long)pRVar49 * 4);
                local_1364 = local_1218[(long)pRVar49];
                local_1360 = local_1208[(long)pRVar49];
                local_135c = (&local_1258)[(long)pRVar49];
                local_1358 = *(undefined4 *)(local_1248 + (long)pRVar49 * 4);
                local_1354 = *(undefined4 *)(lVar10 + 0x50 + (long)pRVar49 * 4);
                local_1350 = uVar50;
                local_134c = pRVar41->instID[0];
                local_1348 = pRVar41->instPrimID[0];
                (ray->super_RayK<1>).tfar = local_1238[(long)pRVar49];
                local_13fc._0_4_ = -NAN;
                local_13a8.valid = (int *)local_13fc;
                local_13a8.geometryUserPtr = pGVar21->userPtr;
                local_13a8.context = pRVar41;
                local_13a8.ray = (RTCRayN *)ray;
                local_13a8.hit = (RTCHitN *)&local_1368;
                local_13a8.N = 1;
                _local_13e8 = pGVar21;
                if (((pGVar21->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                    ((*pGVar21->intersectionFilterN)(&local_13a8),
                    pRVar46 = (RayQueryContext *)local_13fc._12_8_, ray = (RayHit *)local_13fc._4_8_
                    , (((RayK<1> *)local_13a8.valid)->org).field_0.m128[0] != 0.0)) &&
                   ((pRVar22->filter == (RTCFilterFunctionN)0x0 ||
                    ((((pRVar22->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                       RTC_RAY_QUERY_FLAG_INCOHERENT &&
                      ((*(byte *)(_local_13e8 + 0x3e) & 0x40) == 0)) ||
                     ((*pRVar22->filter)(&local_13a8),
                     pRVar46 = (RayQueryContext *)local_13fc._12_8_,
                     ray = (RayHit *)local_13fc._4_8_,
                     (((RayK<1> *)local_13a8.valid)->org).field_0.m128[0] != 0.0)))))) {
                  (((Vec3f *)((long)local_13a8.ray + 0x30))->field_0).field_0.x =
                       *(float *)local_13a8.hit;
                  (((Vec3f *)((long)local_13a8.ray + 0x30))->field_0).field_0.y =
                       *(float *)(local_13a8.hit + 4);
                  (((Vec3f *)((long)local_13a8.ray + 0x30))->field_0).field_0.z =
                       *(float *)(local_13a8.hit + 8);
                  *(float *)((long)local_13a8.ray + 0x3c) = *(float *)(local_13a8.hit + 0xc);
                  *(float *)((long)local_13a8.ray + 0x40) = *(float *)(local_13a8.hit + 0x10);
                  *(float *)((long)local_13a8.ray + 0x44) = *(float *)(local_13a8.hit + 0x14);
                  *(float *)((long)local_13a8.ray + 0x48) = *(float *)(local_13a8.hit + 0x18);
                  *(float *)((long)local_13a8.ray + 0x4c) = *(float *)(local_13a8.hit + 0x1c);
                  *(float *)((long)local_13a8.ray + 0x50) = *(float *)(local_13a8.hit + 0x20);
                  pRVar38 = (RayHit *)local_13a8.ray;
                }
                else {
                  *(float *)(local_13fc._4_8_ + 0x20) = local_1428;
                  pRVar38 = (RayHit *)local_13a8.valid;
                  pRVar46 = (RayQueryContext *)local_13fc._12_8_;
                  ray = (RayHit *)local_13fc._4_8_;
                }
                *(undefined4 *)(local_13d8 + (long)pRVar49 * 4) = 0;
                local_1428 = (ray->super_RayK<1>).tfar;
                local_13d8._0_4_ = -(uint)(fVar135 <= local_1428) & local_13d8._0_4_;
                local_13d8._4_4_ = -(uint)(fVar75 <= local_1428) & local_13d8._4_4_;
                local_13d8._8_4_ = -(uint)(fVar77 <= local_1428) & local_13d8._8_4_;
                local_13d8._12_4_ = -(uint)(fVar148 <= local_1428) & local_13d8._12_4_;
                context = (RayQueryContext *)(ulong)(uint)(ray->super_RayK<1>).mask;
LAB_00d12531:
                uVar39 = (undefined4)((ulong)pRVar38 >> 0x20);
                uVar50 = movmskps((int)pRVar38,local_13d8._0_16_);
                if (uVar50 == 0) goto LAB_00d12839;
                BVHNIntersector1<4,1,true,embree::sse2::ArrayIntersector1<embree::sse2::QuadMiIntersector1Pluecker<4,true>>>
                ::intersect();
                pRVar46 = (RayQueryContext *)local_13fc._12_8_;
                ray = (RayHit *)local_13fc._4_8_;
                pRVar49 = (RayHit *)local_13a8.valid;
                goto LAB_00d124dc;
              }
            }
LAB_00d12927:
            local_13b8 = (Geometry *)CONCAT44(local_13b8._4_4_,local_13b8._4_4_);
            auStack_13b0[0] = (uint)local_13b8._4_4_;
            auStack_13ac[0] = (uint)local_13b8._4_4_;
            local_11b8 = local_11b8 - fVar137;
            fStack_11b4 = fStack_11b4 - fVar137;
            fStack_11b0 = fStack_11b0 - fVar137;
            fStack_11ac = fStack_11ac - fVar137;
            local_11d8 = local_11d8 - (float)local_12e8._0_4_;
            fStack_11d4 = fStack_11d4 - (float)local_12e8._4_4_;
            fStack_11d0 = fStack_11d0 - fStack_12e0;
            fStack_11cc = fStack_11cc - fStack_12dc;
            local_11c8._0_4_ = (float)local_11c8 - local_1338;
            local_11c8._4_4_ = local_11c8._4_4_ - local_1338;
            fStack_11c0 = fStack_11c0 - local_1338;
            fStack_11bc = fStack_11bc - local_1338;
            fVar153 = local_1148 - (float)local_11c8;
            fVar154 = fStack_1144 - local_11c8._4_4_;
            fStack_1440 = fStack_1140 - fStack_11c0;
            fStack_143c = fStack_113c - fStack_11bc;
            local_1338 = local_1128 - local_11d8;
            fStack_1334 = fStack_1124 - fStack_11d4;
            fStack_1330 = fStack_1120 - fStack_11d0;
            fStack_132c = fStack_111c - fStack_11cc;
            fVar129 = local_1138 - local_11b8;
            fVar136 = fStack_1134 - fStack_11b4;
            fVar138 = fStack_1130 - fStack_11b0;
            fVar140 = fStack_112c - fStack_11ac;
            fVar106 = local_1328 - local_1128;
            fVar116 = fStack_1324 - fStack_1124;
            fVar119 = fStack_1320 - fStack_1120;
            fVar120 = fStack_131c - fStack_111c;
            fVar121 = local_12d8 - local_1138;
            fVar122 = fStack_12d4 - fStack_1134;
            fVar127 = fStack_12d0 - fStack_1130;
            fVar128 = fStack_12cc - fStack_112c;
            fVar63 = local_12f8 - local_1148;
            fVar75 = fStack_12f4 - fStack_1144;
            fVar76 = fStack_12f0 - fStack_1140;
            fVar77 = fStack_12ec - fStack_113c;
            local_1378 = CONCAT44(fVar136,fVar129);
            uStack_1370 = CONCAT44(fVar140,fVar138);
            fVar146 = local_11d8 - local_1328;
            fVar148 = fStack_11d4 - fStack_1324;
            fVar78 = fStack_11d0 - fStack_1320;
            fVar135 = fStack_11cc - fStack_131c;
            fVar137 = local_13e8;
            fVar62 = fStack_13e4;
            fVar141 = local_11b8 - local_12d8;
            fVar142 = fStack_11b4 - fStack_12d4;
            fVar143 = fStack_11b0 - fStack_12d0;
            fVar144 = fStack_11ac - fStack_12cc;
            fVar139 = (local_1338 * (local_1138 + local_11b8) - fVar129 * (local_1128 + local_11d8))
                      * fStack_1434 +
                      (fVar129 * (local_1148 + (float)local_11c8) -
                      (local_1138 + local_11b8) * fVar153) * local_13b8._4_4_ +
                      ((local_1128 + local_11d8) * fVar153 -
                      (local_1148 + (float)local_11c8) * local_1338) * local_13e8;
            fVar150 = (fStack_1334 * (fStack_1134 + fStack_11b4) -
                      fVar136 * (fStack_1124 + fStack_11d4)) * fStack_1434 +
                      (fVar136 * (fStack_1144 + local_11c8._4_4_) -
                      (fStack_1134 + fStack_11b4) * fVar154) * local_13b8._4_4_ +
                      ((fStack_1124 + fStack_11d4) * fVar154 -
                      (fStack_1144 + local_11c8._4_4_) * fStack_1334) * fStack_13e4;
            local_12e8 = (undefined1  [8])CONCAT44(fVar150,fVar139);
            fStack_12e0 = (fStack_1330 * (fStack_1130 + fStack_11b0) -
                          fVar138 * (fStack_1120 + fStack_11d0)) * fStack_1434 +
                          (fVar138 * (fStack_1140 + fStack_11c0) -
                          (fStack_1130 + fStack_11b0) * fStack_1440) * local_13b8._4_4_ +
                          ((fStack_1120 + fStack_11d0) * fStack_1440 -
                          (fStack_1140 + fStack_11c0) * fStack_1330) * fStack_13dc;
            fStack_12dc = (fStack_132c * (fStack_112c + fStack_11ac) -
                          fVar140 * (fStack_111c + fStack_11cc)) * fStack_1434 +
                          (fVar140 * (fStack_113c + fStack_11bc) -
                          (fStack_112c + fStack_11ac) * fStack_143c) * local_13b8._4_4_ +
                          ((fStack_111c + fStack_11cc) * fStack_143c -
                          (fStack_113c + fStack_11bc) * fStack_132c) * fStack_13dc;
            fVar145 = (float)local_11c8 - local_12f8;
            fVar149 = local_11c8._4_4_ - fStack_12f4;
            fVar151 = fStack_11c0 - fStack_12f0;
            fVar152 = fStack_11bc - fStack_12ec;
            local_12f8 = (fVar146 * (local_12d8 + local_11b8) - fVar141 * (local_1328 + local_11d8))
                         * fStack_1434 +
                         (fVar141 * (local_12f8 + (float)local_11c8) -
                         (local_12d8 + local_11b8) * fVar145) * local_13b8._4_4_ +
                         ((local_1328 + local_11d8) * fVar145 -
                         (local_12f8 + (float)local_11c8) * fVar146) * local_13e8;
            fStack_12f4 = (fVar148 * (fStack_12d4 + fStack_11b4) -
                          fVar142 * (fStack_1324 + fStack_11d4)) * fStack_1434 +
                          (fVar142 * (fStack_12f4 + local_11c8._4_4_) -
                          (fStack_12d4 + fStack_11b4) * fVar149) * local_13b8._4_4_ +
                          ((fStack_1324 + fStack_11d4) * fVar149 -
                          (fStack_12f4 + local_11c8._4_4_) * fVar148) * fStack_13e4;
            fStack_12f0 = (fVar78 * (fStack_12d0 + fStack_11b0) -
                          fVar143 * (fStack_1320 + fStack_11d0)) * fStack_1434 +
                          (fVar143 * (fStack_12f0 + fStack_11c0) -
                          (fStack_12d0 + fStack_11b0) * fVar151) * local_13b8._4_4_ +
                          ((fStack_1320 + fStack_11d0) * fVar151 -
                          (fStack_12f0 + fStack_11c0) * fVar78) * fStack_13dc;
            fStack_12ec = (fVar135 * (fStack_12cc + fStack_11ac) -
                          fVar144 * (fStack_131c + fStack_11cc)) * fStack_1434 +
                          (fVar144 * (fStack_12ec + fStack_11bc) -
                          (fStack_12cc + fStack_11ac) * fVar152) * local_13b8._4_4_ +
                          ((fStack_131c + fStack_11cc) * fVar152 -
                          (fStack_12ec + fStack_11bc) * fVar135) * fStack_13dc;
            local_12d8 = fVar121;
            fStack_12d4 = fVar122;
            fStack_12d0 = fVar127;
            fStack_12cc = fVar128;
            local_1328 = fVar106;
            fStack_1324 = fVar116;
            fStack_1320 = fVar119;
            fStack_131c = fVar120;
            auVar125._0_4_ =
                 (fVar106 * (float)local_1308._0_4_ - fVar121 * local_1118) * fStack_1434 +
                 (fVar121 * local_1108 - (float)local_1308._0_4_ * fVar63) * local_13b8._4_4_ +
                 (local_1118 * fVar63 - local_1108 * fVar106) * local_13e8;
            auVar125._4_4_ =
                 (fVar116 * (float)local_1308._4_4_ - fVar122 * fStack_1114) * fStack_1434 +
                 (fVar122 * fStack_1104 - (float)local_1308._4_4_ * fVar75) * local_13b8._4_4_ +
                 (fStack_1114 * fVar75 - fStack_1104 * fVar116) * fStack_13e4;
            auVar125._8_4_ =
                 (fVar119 * fStack_1300 - fVar127 * fStack_1110) * fStack_1434 +
                 (fVar127 * fStack_1100 - fStack_1300 * fVar76) * local_13b8._4_4_ +
                 (fStack_1110 * fVar76 - fStack_1100 * fVar119) * fStack_13dc;
            auVar125._12_4_ =
                 (fVar120 * fStack_12fc - fVar128 * fStack_110c) * fStack_1434 +
                 (fVar128 * fStack_10fc - fStack_12fc * fVar77) * local_13b8._4_4_ +
                 (fStack_110c * fVar77 - fStack_10fc * fVar120) * fStack_13dc;
            fVar155 = fVar139 + local_12f8 + auVar125._0_4_;
            fVar156 = fVar150 + fStack_12f4 + auVar125._4_4_;
            fVar157 = fStack_12e0 + fStack_12f0 + auVar125._8_4_;
            fVar158 = fStack_12dc + fStack_12ec + auVar125._12_4_;
            auVar69._8_4_ = fStack_12e0;
            auVar69._0_8_ = local_12e8;
            auVar69._12_4_ = fStack_12dc;
            auVar26._4_4_ = fStack_12f4;
            auVar26._0_4_ = local_12f8;
            auVar26._8_4_ = fStack_12f0;
            auVar26._12_4_ = fStack_12ec;
            auVar107 = minps(auVar69,auVar26);
            auVar107 = minps(auVar107,auVar125);
            auVar27._4_4_ = fStack_12f4;
            auVar27._0_4_ = local_12f8;
            auVar27._8_4_ = fStack_12f0;
            auVar27._12_4_ = fStack_12ec;
            auVar86 = maxps(_local_12e8,auVar27);
            auVar86 = maxps(auVar86,auVar125);
            fVar83 = ABS(fVar155) * 1.1920929e-07;
            fVar93 = ABS(fVar156) * 1.1920929e-07;
            fVar104 = ABS(fVar157) * 1.1920929e-07;
            fVar105 = ABS(fVar158) * 1.1920929e-07;
            auVar114._4_4_ = -(uint)(auVar86._4_4_ <= fVar93);
            auVar114._0_4_ = -(uint)(auVar86._0_4_ <= fVar83);
            auVar114._8_4_ = -(uint)(auVar86._8_4_ <= fVar104);
            auVar114._12_4_ = -(uint)(auVar86._12_4_ <= fVar105);
            auVar70._4_4_ = -(uint)(-fVar93 <= auVar107._4_4_);
            auVar70._0_4_ = -(uint)(-fVar83 <= auVar107._0_4_);
            auVar70._8_4_ = -(uint)(-fVar104 <= auVar107._8_4_);
            auVar70._12_4_ = -(uint)(-fVar105 <= auVar107._12_4_);
            _local_1308 = auVar114 | auVar70;
            iVar34 = movmskps(uVar50,_local_1308);
            if (iVar34 != 0) {
              auVar107 = _local_1308;
              uStack_13e0 = fStack_13dc;
              uVar54 = (uint)DAT_01f7b6c0;
              uVar53 = DAT_01f7b6c0._4_4_;
              uVar57 = DAT_01f7b6c0._8_4_;
              uVar61 = DAT_01f7b6c0._12_4_;
              uVar50 = -(uint)((float)((uint)(fVar141 * fVar106) & uVar54) <=
                              (float)((uint)(fVar129 * fVar146) & uVar54));
              uVar58 = -(uint)((float)((uint)(fVar142 * fVar116) & uVar53) <=
                              (float)((uint)(fVar136 * fVar148) & uVar53));
              uVar55 = -(uint)((float)((uint)(fVar143 * fVar119) & uVar57) <=
                              (float)((uint)(fVar138 * fVar78) & uVar57));
              uVar59 = -(uint)((float)((uint)(fVar144 * fVar120) & uVar61) <=
                              (float)((uint)(fVar140 * fVar135) & uVar61));
              uVar51 = -(uint)((float)((uint)(fVar145 * fVar121) & uVar54) <=
                              (float)((uint)(fVar153 * fVar141) & uVar54));
              uVar52 = -(uint)((float)((uint)(fVar149 * fVar122) & uVar53) <=
                              (float)((uint)(fVar154 * fVar142) & uVar53));
              uVar56 = -(uint)((float)((uint)(fVar151 * fVar127) & uVar57) <=
                              (float)((uint)(fStack_1440 * fVar143) & uVar57));
              uVar60 = -(uint)((float)((uint)(fVar152 * fVar128) & uVar61) <=
                              (float)((uint)(fStack_143c * fVar144) & uVar61));
              uVar54 = -(uint)((float)((uint)(fVar146 * fVar63) & uVar54) <=
                              (float)((uint)(local_1338 * fVar145) & uVar54));
              uVar53 = -(uint)((float)((uint)(fVar148 * fVar75) & uVar53) <=
                              (float)((uint)(fStack_1334 * fVar149) & uVar53));
              uVar57 = -(uint)((float)((uint)(fVar78 * fVar76) & uVar57) <=
                              (float)((uint)(fStack_1330 * fVar151) & uVar57));
              uVar61 = -(uint)((float)((uint)(fVar135 * fVar77) & uVar61) <=
                              (float)((uint)(fStack_132c * fVar152) & uVar61));
              auVar91._0_4_ = (uint)(fVar146 * fVar121 - fVar141 * fVar106) & uVar50;
              auVar91._4_4_ = (uint)(fVar148 * fVar122 - fVar142 * fVar116) & uVar58;
              auVar91._8_4_ = (uint)(fVar78 * fVar127 - fVar143 * fVar119) & uVar55;
              auVar91._12_4_ = (uint)(fVar135 * fVar128 - fVar144 * fVar120) & uVar59;
              auVar126._0_4_ = ~uVar50 & (uint)(local_1338 * fVar141 - fVar129 * fVar146);
              auVar126._4_4_ = ~uVar58 & (uint)(fStack_1334 * fVar142 - fVar136 * fVar148);
              auVar126._8_4_ = ~uVar55 & (uint)(fStack_1330 * fVar143 - fVar138 * fVar78);
              auVar126._12_4_ = ~uVar59 & (uint)(fStack_132c * fVar144 - fVar140 * fVar135);
              local_12a8._4_4_ = fVar156;
              local_12a8._0_4_ = fVar155;
              local_12a8._8_4_ = fVar157;
              local_12a8._12_4_ = fVar158;
              _local_1298 = auVar126 | auVar91;
              local_1288 = (float)(~uVar51 & (uint)(fVar129 * fVar145 - fVar153 * fVar141) |
                                  (uint)(fVar141 * fVar63 - fVar145 * fVar121) & uVar51);
              fStack_1284 = (float)(~uVar52 & (uint)(fVar136 * fVar149 - fVar154 * fVar142) |
                                   (uint)(fVar142 * fVar75 - fVar149 * fVar122) & uVar52);
              fStack_1280 = (float)(~uVar56 & (uint)(fVar138 * fVar151 - fStack_1440 * fVar143) |
                                   (uint)(fVar143 * fVar76 - fVar151 * fVar127) & uVar56);
              fStack_127c = (float)(~uVar60 & (uint)(fVar140 * fVar152 - fStack_143c * fVar144) |
                                   (uint)(fVar144 * fVar77 - fVar152 * fVar128) & uVar60);
              local_1278 = (float)(~uVar54 & (uint)(fVar153 * fVar146 - local_1338 * fVar145) |
                                  (uint)(fVar145 * fVar106 - fVar146 * fVar63) & uVar54);
              fStack_1274 = (float)(~uVar53 & (uint)(fVar154 * fVar148 - fStack_1334 * fVar149) |
                                   (uint)(fVar149 * fVar116 - fVar148 * fVar75) & uVar53);
              fStack_1270 = (float)(~uVar57 & (uint)(fStack_1440 * fVar78 - fStack_1330 * fVar151) |
                                   (uint)(fVar151 * fVar119 - fVar78 * fVar76) & uVar57);
              fStack_126c = (float)(~uVar61 & (uint)(fStack_143c * fVar135 - fStack_132c * fVar152)
                                   | (uint)(fVar152 * fVar120 - fVar135 * fVar77) & uVar61);
              fVar78 = fStack_1434 * local_1298._0_4_ +
                       local_13b8._4_4_ * local_1288 + fVar137 * local_1278;
              fVar135 = fStack_1434 * local_1298._4_4_ +
                        local_13b8._4_4_ * fStack_1284 + fVar62 * fStack_1274;
              fVar83 = fStack_1434 * local_1298._8_4_ +
                       local_13b8._4_4_ * fStack_1280 + fStack_13dc * fStack_1270;
              fVar93 = fStack_1434 * local_1298._12_4_ +
                       local_13b8._4_4_ * fStack_127c + fStack_13dc * fStack_126c;
              fVar78 = fVar78 + fVar78;
              fVar135 = fVar135 + fVar135;
              fVar83 = fVar83 + fVar83;
              fVar93 = fVar93 + fVar93;
              auVar71._0_4_ = local_11d8 * local_1288 + local_11b8 * local_1278;
              auVar71._4_4_ = fStack_11d4 * fStack_1284 + fStack_11b4 * fStack_1274;
              auVar71._8_4_ = fStack_11d0 * fStack_1280 + fStack_11b0 * fStack_1270;
              auVar71._12_4_ = fStack_11cc * fStack_127c + fStack_11ac * fStack_126c;
              fVar76 = (float)local_11c8 * local_1298._0_4_ + auVar71._0_4_;
              fVar77 = local_11c8._4_4_ * local_1298._4_4_ + auVar71._4_4_;
              fVar146 = fStack_11c0 * local_1298._8_4_ + auVar71._8_4_;
              fVar148 = fStack_11bc * local_1298._12_4_ + auVar71._12_4_;
              auVar28._4_4_ = fVar135;
              auVar28._0_4_ = fVar78;
              auVar28._8_4_ = fVar83;
              auVar28._12_4_ = fVar93;
              auVar86 = rcpps(auVar71,auVar28);
              fVar137 = auVar86._0_4_;
              fVar62 = auVar86._4_4_;
              fVar63 = auVar86._8_4_;
              fVar75 = auVar86._12_4_;
              fVar76 = ((1.0 - fVar78 * fVar137) * fVar137 + fVar137) * (fVar76 + fVar76);
              fVar77 = ((1.0 - fVar135 * fVar62) * fVar62 + fVar62) * (fVar77 + fVar77);
              fVar63 = ((1.0 - fVar83 * fVar63) * fVar63 + fVar63) * (fVar146 + fVar146);
              fVar75 = ((1.0 - fVar93 * fVar75) * fVar75 + fVar75) * (fVar148 + fVar148);
              fVar137 = (ray->super_RayK<1>).tfar;
              uVar50 = (ray->super_RayK<1>).mask;
              fVar62 = (ray->super_RayK<1>).org.field_0.m128[3];
              auVar72._4_4_ = -(uint)(fVar62 <= fVar77);
              auVar72._0_4_ = -(uint)(fVar62 <= fVar76);
              auVar72._8_4_ = -(uint)(fVar62 <= fVar63);
              auVar72._12_4_ = -(uint)(fVar62 <= fVar75);
              local_1268 = -(uint)(fVar78 != 0.0) & local_1308._0_4_ &
                           -(uint)(fVar76 <= fVar137 && fVar62 <= fVar76);
              uStack_1264 = -(uint)(fVar135 != 0.0) & local_1308._4_4_ &
                            -(uint)(fVar77 <= fVar137 && fVar62 <= fVar77);
              uStack_1260 = -(uint)(fVar83 != 0.0) & (uint)fStack_1300 &
                            -(uint)(fVar63 <= fVar137 && fVar62 <= fVar63);
              uStack_125c = -(uint)(fVar93 != 0.0) & (uint)fStack_12fc &
                            -(uint)(fVar75 <= fVar137 && fVar62 <= fVar75);
              auVar29._4_4_ = uStack_1264;
              auVar29._0_4_ = local_1268;
              auVar29._8_4_ = uStack_1260;
              auVar29._12_4_ = uStack_125c;
              iVar34 = movmskps(iVar34,auVar29);
              fStack_1440 = fVar157;
              fStack_143c = fVar158;
              if (iVar34 != 0) {
                fStack_12c0 = fStack_12e0;
                local_12c8 = local_12e8;
                fStack_12bc = fStack_12dc;
                local_12b8 = local_12f8;
                fStack_12b4 = fStack_12f4;
                fStack_12b0 = fStack_12f0;
                fStack_12ac = fStack_12ec;
                local_1238[0] = fVar76;
                local_1238[1] = fVar77;
                local_1238[2] = fVar63;
                local_1238[3] = fVar75;
                local_11f8 = local_1068._0_4_;
                uStack_11f4 = local_1068._4_4_;
                uStack_11f0 = local_1068._8_4_;
                uStack_11ec = local_1068._12_4_;
                _local_13e8 = pRVar46->scene;
                local_13d8._4_4_ = uStack_1264;
                local_13d8._0_4_ = local_1268;
                local_13d8._8_4_ = uStack_1260;
                local_13d8._12_4_ = uStack_125c;
                auVar86 = rcpps(auVar72,local_12a8);
                fVar62 = auVar86._0_4_;
                fVar146 = auVar86._4_4_;
                fVar148 = auVar86._8_4_;
                fVar78 = auVar86._12_4_;
                fVar83 = (float)DAT_01f7ba10;
                fVar93 = DAT_01f7ba10._4_4_;
                fVar104 = DAT_01f7ba10._12_4_;
                fVar135 = DAT_01f7ba10._8_4_;
                fVar62 = (float)(-(uint)(1e-18 <= ABS(fVar155)) &
                                (uint)((fVar83 - fVar155 * fVar62) * fVar62 + fVar62));
                fVar146 = (float)(-(uint)(1e-18 <= ABS(fVar156)) &
                                 (uint)((fVar93 - fVar156 * fVar146) * fVar146 + fVar146));
                fVar148 = (float)(-(uint)(1e-18 <= ABS(fVar157)) &
                                 (uint)((fVar135 - fVar157 * fVar148) * fVar148 + fVar148));
                fVar78 = (float)(-(uint)(1e-18 <= ABS(fVar158)) &
                                (uint)((fVar104 - fVar158 * fVar78) * fVar78 + fVar78));
                auVar132._0_4_ = fVar139 * fVar62;
                auVar132._4_4_ = fVar150 * fVar146;
                auVar132._8_4_ = fStack_12e0 * fVar148;
                auVar132._12_4_ = fStack_12dc * fVar78;
                auVar133 = minps(auVar132,_DAT_01f7ba10);
                auVar100._0_4_ = fVar62 * local_12f8;
                auVar100._4_4_ = fVar146 * fStack_12f4;
                auVar100._8_4_ = fVar148 * fStack_12f0;
                auVar100._12_4_ = fVar78 * fStack_12ec;
                auVar86 = minps(auVar100,_DAT_01f7ba10);
                local_1258 = (float)((uint)auVar133._0_4_ & local_1078._0_4_ |
                                    (uint)(fVar83 - auVar133._0_4_) & local_1068._0_4_);
                uStack_1254 = (uint)auVar133._4_4_ & local_1078._4_4_ |
                              (uint)(fVar93 - auVar133._4_4_) & local_1068._4_4_;
                uStack_1250 = (uint)auVar133._8_4_ & local_1078._8_4_ |
                              (uint)(fVar135 - auVar133._8_4_) & local_1068._8_4_;
                uStack_124c = (uint)auVar133._12_4_ & local_1078._12_4_ |
                              (uint)(fVar104 - auVar133._12_4_) & local_1068._12_4_;
                auVar115._0_4_ = (uint)(fVar83 - auVar86._0_4_) & local_1068._0_4_;
                auVar115._4_4_ = (uint)(fVar93 - auVar86._4_4_) & local_1068._4_4_;
                auVar115._8_4_ = (uint)(fVar135 - auVar86._8_4_) & local_1068._8_4_;
                auVar115._12_4_ = (uint)(fVar104 - auVar86._12_4_) & local_1068._12_4_;
                auVar101._0_4_ = (uint)auVar86._0_4_ & local_1078._0_4_;
                auVar101._4_4_ = (uint)auVar86._4_4_ & local_1078._4_4_;
                auVar101._8_4_ = (uint)auVar86._8_4_ & local_1078._8_4_;
                auVar101._12_4_ = (uint)auVar86._12_4_ & local_1078._12_4_;
                local_1248 = auVar101 | auVar115;
                _local_1228 = _local_1298;
                local_1218[0] = local_1288;
                local_1218[1] = fStack_1284;
                local_1218[2] = fStack_1280;
                local_1218[3] = fStack_127c;
                local_1208[0] = local_1278;
                local_1208[1] = fStack_1274;
                local_1208[2] = fStack_1270;
                local_1208[3] = fStack_126c;
                auVar73._0_4_ = (uint)fVar76 & local_1268;
                auVar73._4_4_ = (uint)fVar77 & uStack_1264;
                auVar73._8_4_ = (uint)fVar63 & uStack_1260;
                auVar73._12_4_ = (uint)fVar75 & uStack_125c;
                auVar92._0_8_ = CONCAT44(~uStack_1264,~local_1268) & 0x7f8000007f800000;
                auVar92._8_4_ = ~uStack_1260 & 0x7f800000;
                auVar92._12_4_ = ~uStack_125c & 0x7f800000;
                auVar92 = auVar92 | auVar73;
                auVar74._4_4_ = auVar92._0_4_;
                auVar74._0_4_ = auVar92._4_4_;
                auVar74._8_4_ = auVar92._12_4_;
                auVar74._12_4_ = auVar92._8_4_;
                auVar86 = minps(auVar74,auVar92);
                auVar102._0_8_ = auVar86._8_8_;
                auVar102._8_4_ = auVar86._0_4_;
                auVar102._12_4_ = auVar86._4_4_;
                auVar86 = minps(auVar102,auVar86);
                auVar103._0_4_ = -(uint)(auVar86._0_4_ == auVar92._0_4_) & local_1268;
                auVar103._4_4_ = -(uint)(auVar86._4_4_ == auVar92._4_4_) & uStack_1264;
                auVar103._8_4_ = -(uint)(auVar86._8_4_ == auVar92._8_4_) & uStack_1260;
                auVar103._12_4_ = -(uint)(auVar86._12_4_ == auVar92._12_4_) & uStack_125c;
                iVar34 = movmskps(iVar34,auVar103);
                uVar51 = local_1268;
                uVar54 = uStack_1264;
                uVar58 = uStack_1260;
                uVar52 = uStack_125c;
                if (iVar34 != 0) {
                  uVar51 = auVar103._0_4_;
                  uVar54 = auVar103._4_4_;
                  uVar58 = auVar103._8_4_;
                  uVar52 = auVar103._12_4_;
                }
                auVar30._4_4_ = uVar54;
                auVar30._0_4_ = uVar51;
                auVar30._8_4_ = uVar58;
                auVar30._12_4_ = uVar52;
                uVar35 = movmskps(iVar34,auVar30);
                pRVar49 = (RayHit *)0x0;
                _local_1308 = auVar107;
                if (CONCAT44(uVar39,uVar35) != 0) {
                  for (; (CONCAT44(uVar39,uVar35) >> (long)pRVar49 & 1) == 0;
                      pRVar49 = (RayHit *)((long)(pRVar49->super_RayK<1>).org.field_0.m128 + 1)) {
                  }
                }
                do {
                  uVar47 = local_1318;
                  uVar51 = puVar44[(long)pRVar49];
                  context = (RayQueryContext *)
                            (((Scene *)_local_13e8)->geometries).items[uVar51].ptr;
                  if ((((Geometry *)context)->mask & uVar50) == 0) {
                    *(undefined4 *)(local_13d8 + (long)pRVar49 * 4) = 0;
                    uVar47 = local_1318;
                  }
                  else {
                    pRVar22 = pRVar46->args;
                    if (pRVar22->filter == (RTCFilterFunctionN)0x0) {
                      pRVar41 = pRVar46->user;
                      if (((Geometry *)context)->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                        fVar137 = (&local_1258)[(long)pRVar49];
                        fVar62 = *(float *)(local_1248 + (long)pRVar49 * 4);
                        (ray->super_RayK<1>).tfar = local_1238[(long)pRVar49];
                        (ray->Ng).field_0.field_0.x = *(float *)(local_1228 + (long)pRVar49 * 4);
                        (ray->Ng).field_0.field_0.y = local_1218[(long)pRVar49];
                        (ray->Ng).field_0.field_0.z = local_1208[(long)pRVar49];
                        ray->u = fVar137;
                        ray->v = fVar62;
                        uVar50 = *(uint *)(lVar10 + 0x50 + (long)pRVar49 * 4);
                        context = (RayQueryContext *)(ulong)uVar50;
                        ray->primID = uVar50;
                        ray->geomID = uVar51;
                        ray->instID[0] = pRVar41->instID[0];
                        ray->instPrimID[0] = pRVar41->instPrimID[0];
                        uVar48 = local_1310;
                        break;
                      }
                      local_13b8 = (Geometry *)context;
                    }
                    else {
                      local_13b8 = (Geometry *)context;
                      pRVar41 = pRVar46->user;
                    }
                    local_1368 = *(float *)(local_1228 + (long)pRVar49 * 4);
                    local_1364 = local_1218[(long)pRVar49];
                    local_1360 = local_1208[(long)pRVar49];
                    local_135c = (&local_1258)[(long)pRVar49];
                    local_1358 = *(undefined4 *)(local_1248 + (long)pRVar49 * 4);
                    local_1354 = *(undefined4 *)(lVar10 + 0x50 + (long)pRVar49 * 4);
                    local_1350 = uVar51;
                    local_134c = pRVar41->instID[0];
                    local_1348 = pRVar41->instPrimID[0];
                    (ray->super_RayK<1>).tfar = local_1238[(long)pRVar49];
                    local_13fc._0_4_ = -NAN;
                    local_13a8.valid = (int *)local_13fc;
                    local_13a8.geometryUserPtr = ((Geometry *)context)->userPtr;
                    local_13a8.context = pRVar41;
                    local_13a8.ray = (RTCRayN *)ray;
                    local_13a8.hit = (RTCHitN *)&local_1368;
                    local_13a8.N = 1;
                    local_13b8 = (Geometry *)context;
                    if (((((Geometry *)context)->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                        ((*((Geometry *)context)->intersectionFilterN)(&local_13a8),
                        context = (RayQueryContext *)extraout_RDX,
                        pRVar46 = (RayQueryContext *)local_13fc._12_8_,
                        ray = (RayHit *)local_13fc._4_8_,
                        (((RayK<1> *)local_13a8.valid)->org).field_0.m128[0] != 0.0)) &&
                       (((pRVar22->filter == (RTCFilterFunctionN)0x0 ||
                         (((pRVar22->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                           RTC_RAY_QUERY_FLAG_INCOHERENT &&
                          (((local_13b8->field_8).field_0x2 & 0x40) == 0)))) ||
                        ((*pRVar22->filter)(&local_13a8),
                        context = (RayQueryContext *)extraout_RDX_00,
                        pRVar46 = (RayQueryContext *)local_13fc._12_8_,
                        ray = (RayHit *)local_13fc._4_8_,
                        (((RayK<1> *)local_13a8.valid)->org).field_0.m128[0] != 0.0)))) {
                      (((Vec3f *)((long)local_13a8.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_13a8.hit;
                      (((Vec3f *)((long)local_13a8.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_13a8.hit + 4);
                      (((Vec3f *)((long)local_13a8.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_13a8.hit + 8);
                      *(float *)((long)local_13a8.ray + 0x3c) = *(float *)(local_13a8.hit + 0xc);
                      *(float *)((long)local_13a8.ray + 0x40) = *(float *)(local_13a8.hit + 0x10);
                      *(float *)((long)local_13a8.ray + 0x44) = *(float *)(local_13a8.hit + 0x14);
                      *(float *)((long)local_13a8.ray + 0x48) = *(float *)(local_13a8.hit + 0x18);
                      context = (RayQueryContext *)(ulong)(uint)*(float *)(local_13a8.hit + 0x1c);
                      *(float *)((long)local_13a8.ray + 0x4c) = *(float *)(local_13a8.hit + 0x1c);
                      *(float *)((long)local_13a8.ray + 0x50) = *(float *)(local_13a8.hit + 0x20);
                      pRVar38 = (RayHit *)local_13a8.ray;
                    }
                    else {
                      *(float *)(local_13fc._4_8_ + 0x20) = fVar137;
                      pRVar38 = (RayHit *)local_13a8.valid;
                      pRVar46 = (RayQueryContext *)local_13fc._12_8_;
                      ray = (RayHit *)local_13fc._4_8_;
                    }
                    uVar51 = (uint)pRVar38;
                    *(undefined4 *)(local_13d8 + (long)pRVar49 * 4) = 0;
                    fVar137 = (ray->super_RayK<1>).tfar;
                    local_13d8._0_4_ = -(uint)(fVar76 <= fVar137) & local_13d8._0_4_;
                    local_13d8._4_4_ = -(uint)(fVar77 <= fVar137) & local_13d8._4_4_;
                    local_13d8._8_4_ = -(uint)(fVar63 <= fVar137) & local_13d8._8_4_;
                    local_13d8._12_4_ = -(uint)(fVar75 <= fVar137) & local_13d8._12_4_;
                    uVar50 = (ray->super_RayK<1>).mask;
                  }
                  iVar34 = movmskps(uVar51,local_13d8._0_16_);
                  uVar48 = local_1310;
                  if (iVar34 == 0) break;
                  BVHNIntersector1<4,1,true,embree::sse2::ArrayIntersector1<embree::sse2::QuadMiIntersector1Pluecker<4,true>>>
                  ::intersect();
                  pRVar46 = (RayQueryContext *)local_13fc._12_8_;
                  ray = (RayHit *)local_13fc._4_8_;
                  pRVar49 = (RayHit *)local_13a8.valid;
                } while( true );
              }
            }
            local_1198 = local_1198 + 1;
          } while (local_1198 != local_11a0);
        }
        fVar137 = (ray->super_RayK<1>).tfar;
        auVar133._4_4_ = fVar137;
        auVar133._0_4_ = fVar137;
        auVar133._8_4_ = fVar137;
        auVar133._12_4_ = fVar137;
        uVar43 = local_13c0;
        fVar120 = local_10b8;
        fVar121 = fStack_10b4;
        fVar122 = fStack_10b0;
        fVar78 = fStack_10ac;
        fVar127 = local_10d8;
        fVar128 = fStack_10d4;
        fVar129 = fStack_10d0;
        fVar63 = fStack_10cc;
        fVar136 = local_10e8;
        fVar138 = fStack_10e4;
        fVar140 = fStack_10e0;
        fVar75 = fStack_10dc;
        fVar141 = local_10f8;
        fVar142 = fStack_10f4;
        fVar143 = fStack_10f0;
        fVar135 = fStack_10ec;
        fVar137 = local_11e8;
        fVar62 = fStack_11e4;
        fVar77 = fStack_11e0;
        fVar83 = fStack_11dc;
        fVar146 = local_1178;
        fVar93 = fStack_1174;
        fVar104 = fStack_1170;
        fVar105 = fStack_116c;
        fVar148 = local_1188;
        fVar106 = fStack_1184;
        fVar116 = fStack_1180;
        fVar119 = fStack_117c;
        fVar144 = local_1098;
        fVar145 = fStack_1094;
        fVar149 = fStack_1090;
        fVar76 = fStack_108c;
        fVar151 = local_10a8;
        fVar152 = fStack_10a4;
        fVar153 = fStack_10a0;
        fVar139 = fStack_109c;
        fVar154 = local_10c8;
        fVar155 = fStack_10c4;
        fVar156 = fStack_10c0;
        fVar150 = fStack_10bc;
      }
    } while (pauVar36 != (undefined1 (*) [16])&local_f78);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }